

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  int *in_stack_00000008;
  int expMax;
  int expTmp;
  float sum23;
  float sum22;
  float sum21;
  float sum20;
  float sum13;
  float sum12;
  float sum11;
  float sum10;
  float p23;
  float p22;
  float p21;
  float p20;
  float p13;
  float p12;
  float p11;
  float p10;
  int k;
  float m233;
  float m232;
  float m231;
  float m230;
  float m223;
  float m222;
  float m221;
  float m220;
  float m213;
  float m212;
  float m211;
  float m210;
  float m203;
  float m202;
  float m201;
  float m200;
  float m133;
  float m132;
  float m131;
  float m130;
  float m123;
  float m122;
  float m121;
  float m120;
  float m113;
  float m112;
  float m111;
  float m110;
  float m103;
  float m102;
  float m101;
  float m100;
  int w;
  int u;
  int l;
  int local_108;
  int local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  uint local_e0;
  uint local_dc;
  float local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  float local_c8;
  uint local_c4;
  int local_c0;
  uint local_bc;
  uint local_b8;
  float local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  float local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  float local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  float local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  float local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  float local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  float local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  float local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
    local_38 = local_34 * 4 * *(int *)(in_RDI + 0x18);
    local_3c = local_34 * 0x14;
    local_40 = *(uint *)(local_20 + (long)local_3c * 4);
    local_44 = *(float *)(local_20 + (long)(local_3c + 1) * 4);
    local_48 = *(uint *)(local_20 + (long)(local_3c + 2) * 4);
    local_4c = *(uint *)(local_20 + (long)(local_3c + 3) * 4);
    local_50 = *(uint *)(local_20 + (long)(local_3c + 5) * 4);
    local_54 = *(float *)(local_20 + (long)(local_3c + 6) * 4);
    local_58 = *(uint *)(local_20 + (long)(local_3c + 7) * 4);
    local_5c = *(uint *)(local_20 + (long)(local_3c + 8) * 4);
    local_60 = *(uint *)(local_20 + (long)(local_3c + 10) * 4);
    local_64 = *(float *)(local_20 + (long)(local_3c + 0xb) * 4);
    local_68 = *(uint *)(local_20 + (long)(local_3c + 0xc) * 4);
    local_6c = *(uint *)(local_20 + (long)(local_3c + 0xd) * 4);
    local_70 = *(uint *)(local_20 + (long)(local_3c + 0xf) * 4);
    local_74 = *(float *)(local_20 + (long)(local_3c + 0x10) * 4);
    local_78 = *(uint *)(local_20 + (long)(local_3c + 0x11) * 4);
    local_7c = *(uint *)(local_20 + (long)(local_3c + 0x12) * 4);
    local_80 = *(uint *)(local_30 + (long)local_3c * 4);
    local_84 = *(float *)(local_30 + (long)(local_3c + 1) * 4);
    local_88 = *(uint *)(local_30 + (long)(local_3c + 2) * 4);
    local_8c = *(uint *)(local_30 + (long)(local_3c + 3) * 4);
    local_90 = *(uint *)(local_30 + (long)(local_3c + 5) * 4);
    local_94 = *(float *)(local_30 + (long)(local_3c + 6) * 4);
    local_98 = *(uint *)(local_30 + (long)(local_3c + 7) * 4);
    local_9c = *(uint *)(local_30 + (long)(local_3c + 8) * 4);
    local_a0 = *(uint *)(local_30 + (long)(local_3c + 10) * 4);
    local_a4 = *(float *)(local_30 + (long)(local_3c + 0xb) * 4);
    local_a8 = *(uint *)(local_30 + (long)(local_3c + 0xc) * 4);
    local_ac = *(uint *)(local_30 + (long)(local_3c + 0xd) * 4);
    local_b0 = *(uint *)(local_30 + (long)(local_3c + 0xf) * 4);
    local_b4 = *(float *)(local_30 + (long)(local_3c + 0x10) * 4);
    local_b8 = *(uint *)(local_30 + (long)(local_3c + 0x11) * 4);
    local_bc = *(uint *)(local_30 + (long)(local_3c + 0x12) * 4);
    for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x14); local_c0 = local_c0 + 1) {
      local_c4 = *(uint *)(local_18 + (long)local_38 * 4);
      local_c8 = *(float *)(local_18 + (long)(local_38 + 1) * 4);
      local_cc = *(uint *)(local_18 + (long)(local_38 + 2) * 4);
      local_d0 = *(uint *)(local_18 + (long)(local_38 + 3) * 4);
      local_d4 = *(uint *)(local_28 + (long)local_38 * 4);
      local_d8 = *(float *)(local_28 + (long)(local_38 + 1) * 4);
      local_dc = *(uint *)(local_28 + (long)(local_38 + 2) * 4);
      local_e0 = *(uint *)(local_28 + (long)(local_38 + 3) * 4);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_c4),ZEXT416(local_40),
                               ZEXT416((uint)(local_44 * local_c8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_cc),ZEXT416(local_48),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d0),ZEXT416(local_4c),auVar1);
      local_e4 = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_c4),ZEXT416(local_50),
                               ZEXT416((uint)(local_54 * local_c8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_cc),ZEXT416(local_58),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d0),ZEXT416(local_5c),auVar1);
      local_e8 = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_c4),ZEXT416(local_60),
                               ZEXT416((uint)(local_64 * local_c8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_cc),ZEXT416(local_68),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d0),ZEXT416(local_6c),auVar1);
      local_ec = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_c4),ZEXT416(local_70),
                               ZEXT416((uint)(local_74 * local_c8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_cc),ZEXT416(local_78),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d0),ZEXT416(local_7c),auVar1);
      local_f0 = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d4),ZEXT416(local_80),
                               ZEXT416((uint)(local_84 * local_d8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_dc),ZEXT416(local_88),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_e0),ZEXT416(local_8c),auVar1);
      local_f4 = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d4),ZEXT416(local_90),
                               ZEXT416((uint)(local_94 * local_d8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_dc),ZEXT416(local_98),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_e0),ZEXT416(local_9c),auVar1);
      local_f8 = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d4),ZEXT416(local_a0),
                               ZEXT416((uint)(local_a4 * local_d8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_dc),ZEXT416(local_a8),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_e0),ZEXT416(local_ac),auVar1);
      local_fc = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416(local_d4),ZEXT416(local_b0),
                               ZEXT416((uint)(local_b4 * local_d8)));
      auVar1 = vfmadd213ss_fma(ZEXT416(local_dc),ZEXT416(local_b8),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416(local_e0),ZEXT416(local_bc),auVar1);
      local_100 = auVar1._0_4_;
      *(float *)(local_10 + (long)local_38 * 4) = local_e4 * local_f4;
      *(float *)(local_10 + (long)(local_38 + 1) * 4) = local_e8 * local_f8;
      *(float *)(local_10 + (long)(local_38 + 2) * 4) = local_ec * local_fc;
      *(float *)(local_10 + (long)(local_38 + 3) * 4) = local_f0 * local_100;
      if (*in_stack_00000008 == 0) {
        frexp((double)*(float *)(local_10 + (long)local_38 * 4),&local_108);
        frexp((double)*(float *)(local_10 + (long)(local_38 + 1) * 4),&local_104);
        iVar2 = local_104;
        if (local_104 < 1) {
          iVar2 = -local_104;
        }
        iVar3 = local_108;
        if (local_108 < 1) {
          iVar3 = -local_108;
        }
        if (iVar3 < iVar2) {
          local_108 = local_104;
        }
        frexp((double)*(float *)(local_10 + (long)(local_38 + 2) * 4),&local_104);
        iVar2 = local_104;
        if (local_104 < 1) {
          iVar2 = -local_104;
        }
        iVar3 = local_108;
        if (local_108 < 1) {
          iVar3 = -local_108;
        }
        if (iVar3 < iVar2) {
          local_108 = local_104;
        }
        frexp((double)*(float *)(local_10 + (long)(local_38 + 3) * 4),&local_104);
        iVar2 = local_104;
        if (local_104 < 1) {
          iVar2 = -local_104;
        }
        iVar3 = local_108;
        if (local_108 < 1) {
          iVar3 = -local_108;
        }
        if (iVar3 < iVar2) {
          local_108 = local_104;
        }
        iVar2 = local_108;
        if (local_108 < 1) {
          iVar2 = -local_108;
        }
        if (*(int *)(in_RDI + 100) < iVar2) {
          *in_stack_00000008 = 1;
        }
      }
      local_38 = local_38 + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const REALTYPE* partials2,
                                                                    const REALTYPE* matrices2,
                                                                    int* activateScaling) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = 0; k < kPatternCount; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            if (*activateScaling == 0) {
                int expTmp;
                int expMax;
                frexp(destP[u], &expMax);
                frexp(destP[u + 1], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 2], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 3], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;

                if(abs(expMax) > scalingExponentThreshold) {
                    *activateScaling = 1;
                }
            }

            u += 4;

        }
    }
}